

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_double_variance(gauden_t *g)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = g->n_mgau;
  for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    uVar3 = g->n_feat;
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      uVar4 = g->n_density;
      for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
        uVar5 = g->veclen[uVar7];
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          fVar1 = g->var[uVar6][uVar7][uVar8][uVar9];
          g->var[uVar6][uVar7][uVar8][uVar9] = fVar1 + fVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_double_variance(gauden_t *g)
{
    uint32 i, j, k, l;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		for (l = 0; l < g->veclen[j]; l++) {
		    g->var[i][j][k][l] += g->var[i][j][k][l];
		}
	    }
	}
    }

    return S3_SUCCESS;
}